

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O1

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::
add_face_texcoords(ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
                  FaceHandle _fh,VertexHandle _vh,
                  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                  *_face_texcoords)

{
  long lVar1;
  bool bVar2;
  pointer pVVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  lVar1 = *(long *)&(this->mesh_->super_Mesh).
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                    .super_PolyConnectivity.field_0xe0;
  uVar10 = *(uint *)(*(long *)&(this->mesh_->super_Mesh).
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                               .super_PolyConnectivity.field_0xf8 +
                    (long)(int)_fh.super_BaseHandle.idx_ * 4);
  lVar4 = (long)((int)uVar10 >> 1);
  lVar7 = lVar4 * 0x20 + lVar1;
  uVar8 = uVar10 & 1;
  uVar9 = uVar8 << 4;
  if ((BaseHandle)*(int *)((ulong)uVar9 + 4 + lVar7) != _vh.super_BaseHandle.idx_) {
    do {
      if (uVar10 == *(uint *)((ulong)uVar9 + 0xc + lVar7)) break;
      uVar10 = *(uint *)((ulong)uVar8 * 0x10 + 8 + lVar4 * 0x20 + lVar1);
      lVar4 = (long)((int)uVar10 >> 1);
      uVar8 = uVar10 & 1;
    } while ((BaseHandle)*(int *)((ulong)(uVar8 << 4) + 4 + lVar4 * 0x20 + lVar1) !=
             _vh.super_BaseHandle.idx_);
  }
  pVVar3 = (_face_texcoords->
           super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((_face_texcoords->
      super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (*(this->super_BaseImporter)._vptr_BaseImporter[0x15])(this,(ulong)uVar10,pVVar3 + uVar5);
      uVar10 = *(uint *)((ulong)((uVar10 & 1) << 4) + 8 +
                        (long)((int)uVar10 >> 1) * 0x20 +
                        *(long *)&(this->mesh_->super_Mesh).
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                  .super_PolyConnectivity.field_0xe0);
      pVVar3 = (_face_texcoords->
               super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(_face_texcoords->
                                    super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

virtual void add_face_texcoords( FaceHandle _fh, VertexHandle _vh, const std::vector<Vec2f>& _face_texcoords) override
  {
    // get first halfedge handle
    HalfedgeHandle cur_heh   = mesh_.halfedge_handle(_fh);
    HalfedgeHandle end_heh   = mesh_.prev_halfedge_handle(cur_heh);

    // find start heh
    while( mesh_.to_vertex_handle(cur_heh) != _vh && cur_heh != end_heh )
      cur_heh = mesh_.next_halfedge_handle( cur_heh);

    for(unsigned int i=0; i<_face_texcoords.size(); ++i)
    {
      set_texcoord( cur_heh, _face_texcoords[i]);
      cur_heh = mesh_.next_halfedge_handle( cur_heh);
    }
  }